

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsc.c
# Opt level: O2

bsc_step_t
bsc_reduce_2tree_multiple
          (bsc_step_t depends,bsp_pid_t root,bsc_group_t group,bsc_coll_params_t *params,
          bsc_size_t n)

{
  undefined8 *puVar1;
  bsc_step_t bVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar4 = 0;
  uVar3 = (ulong)(uint)n;
  if (n < 1) {
    uVar3 = uVar4;
  }
  bVar2 = depends;
  for (; uVar3 * 0x30 - uVar4 != 0; uVar4 = uVar4 + 0x30) {
    puVar1 = (undefined8 *)((long)&params->reducer + uVar4);
    bVar2 = bsc_reduce_qtree_single
                      (depends,root,group,*(void **)((long)&params->src + uVar4),
                       *(void **)((long)&params->dst + uVar4),*(void **)((long)&params->tmp + uVar4)
                       ,(bsc_reduce_t)*puVar1,(void *)puVar1[1],
                       *(bsc_size_t *)((long)&params->nmemb + uVar4),
                       *(bsc_size_t *)((long)&params->size + uVar4),2);
  }
  return bVar2;
}

Assistant:

bsc_step_t bsc_reduce_2tree_multiple( bsc_step_t depends,
                      bsp_pid_t root, bsc_group_t group, 
                      bsc_coll_params_t * params, bsc_size_t n)
{
    bsc_size_t i;
    bsc_step_t finished = depends;
    for ( i = 0; i < n ; ++i ) {
        finished = bsc_reduce_qtree_single( depends, root, group,
                   params[i].src, params[i].dst, params[i].tmp,
                   params[i].reducer, params[i].zero, 
                   params[i].nmemb, params[i].size, 2 );
    }

    return finished;
}